

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O1

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::get
          (FieldGeneratorTable *this,FieldDescriptor *field)

{
  int iVar1;
  FieldDescriptor **ppFVar2;
  Nonnull<const_char_*> pcVar3;
  
  if (field->containing_type_ == this->descriptor_) {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (field->containing_type_,this->descriptor_,
                        "field->containing_type() == descriptor_");
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((field->field_0x1 & 8) == 0) {
      ppFVar2 = &field->containing_type_->fields_;
    }
    else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
      ppFVar2 = &field->file_->extensions_;
    }
    else {
      ppFVar2 = &((field->scope_).extension_scope)->extensions_;
    }
    iVar1 = (int)((long)field - (long)*ppFVar2 >> 3) * -0x45d1745d;
    if (iVar1 < 0) {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)iVar1,0,"field->index() >= 0");
    }
    else {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 8) == 0) {
        ppFVar2 = &field->containing_type_->fields_;
      }
      else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
        ppFVar2 = &field->file_->extensions_;
      }
      else {
        ppFVar2 = &((field->scope_).extension_scope)->extensions_;
      }
      return (this->fields_).
             super__Vector_base<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (int)((ulong)((long)field - (long)*ppFVar2) >> 3) * -0x45d1745d;
    }
  }
  else {
    get();
  }
  get();
}

Assistant:

const FieldGenerator& get(const FieldDescriptor* field) const {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    ABSL_DCHECK_GE(field->index(), 0);
    return fields_[static_cast<size_t>(field->index())];
  }